

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.c
# Opt level: O0

int gladLoadGLES2Loader(GLADloadproc load)

{
  int iVar1;
  GLubyte *pGVar2;
  bool local_19;
  GLADloadproc load_local;
  
  GLVersion.major = 0;
  GLVersion.minor = 0;
  glad_glGetString = (PFNGLGETSTRINGPROC)(*load)("glGetString");
  if (glad_glGetString == (PFNGLGETSTRINGPROC)0x0) {
    load_local._4_4_ = 0;
  }
  else {
    pGVar2 = (*glad_glGetString)(0x1f02);
    if (pGVar2 == (GLubyte *)0x0) {
      load_local._4_4_ = 0;
    }
    else {
      find_coreGLES2();
      load_GL_ES_VERSION_2_0(load);
      load_GL_ES_VERSION_3_0(load);
      iVar1 = find_extensionsGLES2();
      if (iVar1 == 0) {
        load_local._4_4_ = 0;
      }
      else {
        load_GL_EXT_debug_marker(load);
        local_19 = GLVersion.major != 0 || GLVersion.minor != 0;
        load_local._4_4_ = (uint)local_19;
      }
    }
  }
  return load_local._4_4_;
}

Assistant:

int gladLoadGLES2Loader(GLADloadproc load) {
	GLVersion.major = 0; GLVersion.minor = 0;
	glGetString = (PFNGLGETSTRINGPROC)load("glGetString");
	if(glGetString == NULL) return 0;
	if(glGetString(GL_VERSION) == NULL) return 0;
	find_coreGLES2();
	load_GL_ES_VERSION_2_0(load);
	load_GL_ES_VERSION_3_0(load);

	if (!find_extensionsGLES2()) return 0;
	load_GL_EXT_debug_marker(load);
	return GLVersion.major != 0 || GLVersion.minor != 0;
}